

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<QVariant>::resolve<QVariant>
          (PromiseData<QVariant> *this,QVariant *value)

{
  __shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<QVariant,QVariant>((QVariant *)&local_20);
  std::__shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2> *)&this->m_value,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<QVariant,_void_(const_QVariant_&)>::setSettled
            (&this->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }